

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  _func_int ***ppp_Var1;
  execution_context eVar2;
  service *psVar3;
  Config config;
  LoggingHandler<Client> logging_handler;
  ExceptionHandler<Client> exception_handler;
  HTTPHandler<Client> http_handler;
  Server<Client> server;
  Config local_22c;
  IHandler<Client> local_220;
  undefined ***local_218;
  undefined **local_210;
  HTTPHandler<Client> *local_208;
  HTTPHandler<Client> local_200;
  Server<Client> local_180;
  
  local_22c.threads_number = 100;
  local_22c.queue_size = 1000;
  local_22c.port = 0x1ed0;
  HTTPHandler<Client>::HTTPHandler(&local_200,&RESOLVE_PATH_abi_cxx11_,&CERTS_PATH_abi_cxx11_);
  local_218 = &local_210;
  local_210 = &PTR_handle_001e7a80;
  local_220._vptr_IHandler = (_func_int **)&PTR_handle_001e7ab0;
  local_208 = &local_200;
  Server<Client>::Server(&local_180,&local_220,&local_22c);
  Server<Client>::start(&local_180);
  ThreadPool<std::packaged_task<void_()>_>::~ThreadPool(&local_180.thread_pool);
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&local_180.acceptor.acceptor.impl_);
  for (psVar3 = (local_180.acceptor.io_context.super_execution_context.service_registry_)->
                first_service_;
      eVar2.service_registry_ =
           local_180.acceptor.io_context.super_execution_context.service_registry_,
      psVar3 != (service *)0x0; psVar3 = psVar3->next_) {
    (*psVar3->_vptr_service[2])(psVar3);
  }
  psVar3 = (local_180.acceptor.io_context.super_execution_context.service_registry_)->first_service_
  ;
  while (psVar3 != (service *)0x0) {
    ppp_Var1 = &psVar3->_vptr_service;
    psVar3 = psVar3->next_;
    (*(*ppp_Var1)[1])();
    (eVar2.service_registry_)->first_service_ = psVar3;
  }
  if (local_180.acceptor.io_context.super_execution_context.service_registry_ !=
      (service_registry *)0x0) {
    pthread_mutex_destroy
              ((pthread_mutex_t *)
               &(local_180.acceptor.io_context.super_execution_context.service_registry_)->mutex_);
    operator_delete(local_180.acceptor.io_context.super_execution_context.service_registry_,0x40);
  }
  local_200.super_IHandler<Client>._vptr_IHandler = (_func_int **)&PTR_handle_001e4d00;
  std::filesystem::__cxx11::path::~path(&local_200.https_handler.main_dirpath);
  std::filesystem::__cxx11::path::~path(&local_200.https_handler.resolve_path);
  std::filesystem::__cxx11::path::~path(&local_200.resolve_path);
  return 0;
}

Assistant:

int main() {
    Server<Client>::Config config(
        THREADS_NUMBER, 
        QUEUE_SIZE,
        PORT
    );

    HTTPHandler<Client> http_handler(RESOLVE_PATH, CERTS_PATH);
    ExceptionHandler<Client> exception_handler(http_handler);
    LoggingHandler<Client> logging_handler(exception_handler);
    Server<Client> server(logging_handler, config);

    server.start();
}